

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemSetZeroBlob(Mem *pMem,int n)

{
  int in_ESI;
  int *in_RDI;
  int local_c;
  
  sqlite3VdbeMemRelease((Mem *)0x13f577);
  *(undefined2 *)(in_RDI + 5) = 0x410;
  in_RDI[4] = 0;
  local_c = in_ESI;
  if (in_ESI < 0) {
    local_c = 0;
  }
  *in_RDI = local_c;
  *(undefined1 *)((long)in_RDI + 0x16) = 1;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetZeroBlob(Mem *pMem, int n){
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Blob|MEM_Zero;
  pMem->n = 0;
  if( n<0 ) n = 0;
  pMem->u.nZero = n;
  pMem->enc = SQLITE_UTF8;
  pMem->z = 0;
}